

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O3

void __thiscall testing::Message::Message(Message *this,Message *msg)

{
  stringstream *this_00;
  string local_38;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  (this->ss_).ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
  internal::StringStreamToString(&local_38,(msg->ss_).ptr_);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(this_00 + 0x10),local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

Message(const Message& msg) : ss_(new ::std::stringstream) {  // NOLINT
    *ss_ << msg.GetString();
  }